

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportMemory
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits,uint32_t page_size)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Result result;
  undefined1 local_148 [16];
  string local_138;
  allocator<char> local_111;
  string local_110;
  ImportType local_f0;
  uint64_t local_a8;
  uint64_t local_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  MemoryType memory_type;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderInterp *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  GetLocation((Location *)&memory_type.page_size,this);
  result = SharedValidator::OnMemory
                     (&this->validator_,(Location *)&memory_type.page_size,page_limits,page_size);
  bVar2 = Failed(result);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Error);
  }
  else {
    local_a8 = page_limits->initial;
    local_a0 = page_limits->max;
    local_98._0_1_ = page_limits->has_max;
    local_98._1_1_ = page_limits->is_shared;
    local_98._2_1_ = page_limits->is_64;
    local_98._3_5_ = *(undefined5 *)&page_limits->field_0x13;
    MemoryType::MemoryType((MemoryType *)local_90,*page_limits,page_size);
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_110,
               (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str,
               &local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_138,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (allocator<char> *)(local_148 + 0xf));
    MemoryType::Clone((MemoryType *)local_148);
    ImportType::ImportType
              (&local_f0,&local_110,&local_138,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_148);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_f0);
    ImportDesc::~ImportDesc((ImportDesc *)&local_f0);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_148);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)(local_148 + 0xf));
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_90);
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
    MemoryType::~MemoryType((MemoryType *)local_90);
  }
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportMemory(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index memory_index,
                                          const Limits* page_limits,
                                          uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *page_limits, page_size));
  MemoryType memory_type{*page_limits, page_size};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), memory_type.Clone())});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}